

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_finding_on_map.hpp
# Opt level: O2

vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_> * __thiscall
graph_tests::PathFindingOnMap::GetNeighbors
          (vector<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>
           *__return_storage_ptr__,PathFindingOnMap *this,PointOnMap *u)

{
  long lVar1;
  optional<graph_tests::PointOnMap> local_98;
  optional<graph_tests::PointOnMap> local_78;
  optional<graph_tests::PointOnMap> local_58;
  optional<graph_tests::PointOnMap> local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<graph_tests::PointOnMap,_std::allocator<graph_tests::PointOnMap>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetLeft(&local_98,this,u);
  GetUp(&local_78,this,u);
  GetRight(&local_58,this,u);
  GetDown(&local_38,this,u);
  for (lVar1 = 0; lVar1 != 0x80; lVar1 = lVar1 + 0x20) {
    if ((&local_98.super__Optional_base<graph_tests::PointOnMap,_true,_true>._M_payload.
          super__Optional_payload_base<graph_tests::PointOnMap>._M_engaged)[lVar1] == true) {
      std::vector<graph_tests::PointOnMap,std::allocator<graph_tests::PointOnMap>>::
      emplace_back<graph_tests::PointOnMap_const>
                ((vector<graph_tests::PointOnMap,std::allocator<graph_tests::PointOnMap>> *)
                 __return_storage_ptr__,
                 (PointOnMap *)
                 ((long)&local_98.super__Optional_base<graph_tests::PointOnMap,_true,_true>.
                         _M_payload.super__Optional_payload_base<graph_tests::PointOnMap>._M_payload
                 + lVar1));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<PointOnMap> GetNeighbors(const PointOnMap& u) const {
    std::vector<PointOnMap> res;
    for (auto&& neigbor : { GetLeft(u), GetUp(u), GetRight(u), GetDown(u) }) {
      if (neigbor)
        res.emplace_back(std::move(*neigbor));
    }
    return res;
  }